

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O0

Matrix<float,_3,_3> *
math::matrix_inverse<float>
          (Matrix<float,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_3> *m,float *det)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  undefined1 local_44 [8];
  Matrix<float,_3,_3> ret;
  float *det_local;
  Matrix<float,_3,_3> *m_local;
  
  ret.m._28_8_ = det;
  Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)local_44);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,4);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,8);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,5);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,7);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,0);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,2);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,7);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,1);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,8);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,1);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,1);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,5);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,2);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,4);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,2);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,5);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,6);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,3);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,8);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,3);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,0);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,8);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,2);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,6);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,4);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,2);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,3);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,0);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,5);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,5);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,3);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,7);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,4);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,6);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,6);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,1);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,6);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,0);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,7);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,7);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pfVar5 = Matrix<float,_3,_3>::operator[](m,0);
  fVar1 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,4);
  fVar2 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,1);
  fVar3 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[](m,3);
  fVar4 = *pfVar5;
  pfVar5 = Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)local_44,8);
  *pfVar5 = fVar1 * fVar2 + -(fVar3 * fVar4);
  Matrix<float,_3,_3>::operator/
            (__return_storage_ptr__,(Matrix<float,_3,_3> *)local_44,(float *)ret.m._28_8_);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T,3,3>
matrix_inverse (Matrix<T,3,3> const& m, T const& det)
{
    Matrix<T,3,3> ret;
    ret[0] = m[4] * m[8] - m[5] * m[7];
    ret[1] = m[2] * m[7] - m[1] * m[8];
    ret[2] = m[1] * m[5] - m[2] * m[4];
    ret[3] = m[5] * m[6] - m[3] * m[8];
    ret[4] = m[0] * m[8] - m[2] * m[6];
    ret[5] = m[2] * m[3] - m[0] * m[5];
    ret[6] = m[3] * m[7] - m[4] * m[6];
    ret[7] = m[1] * m[6] - m[0] * m[7];
    ret[8] = m[0] * m[4] - m[1] * m[3];
    return ret / det;
}